

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float64 floatx80_to_float64_mips64(floatx80 a,float_status *status)

{
  float64 fVar1;
  ulong uVar2;
  ushort uVar3;
  int zExp;
  ulong uVar4;
  int iVar5;
  floatx80 a_00;
  commonNaNT local_20;
  
  uVar4 = a.low;
  a_00._8_8_ = a._8_8_ & 0xffffffff;
  uVar3 = a.high & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar4 < 0)
  {
    uVar2 = (a._8_8_ & 0xffff) >> 0xf;
    if (uVar3 != 0x7fff) {
      iVar5 = uVar3 - 0x3c01;
      zExp = 0;
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
        zExp = iVar5;
      }
      if (uVar4 != 0) {
        zExp = iVar5;
      }
      fVar1 = roundAndPackFloat64((flag)uVar2,zExp,(ulong)((uint)a.low & 1) | uVar4 >> 1,status);
      return fVar1;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      uVar2 = uVar2 << 0x3f;
    }
    else {
      a_00.low = uVar4;
      floatx80ToCommonNaN(&local_20,a_00,status);
      if ((status->default_nan_mode != '\0') || (local_20.high < 0x1000)) goto LAB_0087722f;
      uVar2 = (ulong)(uint)local_20._0_4_ << 0x3f | local_20.high >> 0xc;
    }
    fVar1 = uVar2 | 0x7ff0000000000000;
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 1;
LAB_0087722f:
    fVar1 = 0x7ff8000000000000;
    if (status->snan_bit_is_one != '\0') {
      fVar1 = 0x7ff7ffffffffffff;
    }
  }
  return fVar1;
}

Assistant:

float64 floatx80_to_float64(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig, zSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float64_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( aSig<<1 ) ) {
            return commonNaNToFloat64(floatx80ToCommonNaN(a, status), status);
        }
        return packFloat64( aSign, 0x7FF, 0 );
    }
    shift64RightJamming( aSig, 1, &zSig );
    if ( aExp || aSig ) aExp -= 0x3C01;
    return roundAndPackFloat64(aSign, aExp, zSig, status);

}